

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomLayerParams::InternalSwap
          (CustomLayerParams *this,CustomLayerParams *other)

{
  intptr_t iVar1;
  void *pvVar2;
  long __tmp;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::InternalSwap
            (&this->weights_,&other->weights_);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  ::InnerMap::Swap((InnerMap *)&this->parameters_,(InnerMap *)&other->parameters_);
  pvVar2 = (other->classname_).tagged_ptr_.ptr_;
  (other->classname_).tagged_ptr_.ptr_ = (this->classname_).tagged_ptr_.ptr_;
  (this->classname_).tagged_ptr_.ptr_ = pvVar2;
  pvVar2 = (other->description_).tagged_ptr_.ptr_;
  (other->description_).tagged_ptr_.ptr_ = (this->description_).tagged_ptr_.ptr_;
  (this->description_).tagged_ptr_.ptr_ = pvVar2;
  return;
}

Assistant:

void CustomLayerParams::InternalSwap(CustomLayerParams* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  parameters_.InternalSwap(&other->parameters_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &classname_, lhs_arena,
      &other->classname_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &description_, lhs_arena,
      &other->description_, rhs_arena
  );
}